

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.h
# Opt level: O3

void __thiscall vpl::Scope::LoadVariableAddr(Scope *this,string *name)

{
  bool bVar1;
  pointer pNVar2;
  ostream *poVar3;
  const_iterator cVar4;
  runtime_error *this_00;
  long lVar5;
  char *pcVar6;
  pointer pNVar7;
  stringstream ss;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  local_1b0[0] = (stringstream)0x23;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(this->out_,(char *)local_1b0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"void vpl::Scope::LoadVariableAddr(const std::string &)",0x36);
  local_1b0[0] = (stringstream)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1b0,1);
  pNVar2 = (this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    pNVar7 = pNVar2;
    if (pNVar7 == (this->scopes_).
                  super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>._M_impl.
                  super__Vector_impl_data._M_start) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Undefined variable `",0x14);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a0,(name->_M_dataplus)._M_p,name->_M_string_length);
      local_1d0[0] = (string)0x60;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1d0,1);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1d0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&pNVar7[-1].offsets_._M_h,name);
    pNVar2 = pNVar7 + -1;
  } while (cVar4.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
           ._M_cur == (__node_type *)0x0);
  poVar3 = this->out_;
  bVar1 = pNVar7[-1].is_global_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    push ",9);
  if (bVar1 == false) {
    cVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&pNVar7[-1].offsets_._M_h,name);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar3,
                        *(int *)((long)cVar4.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                       ._M_cur + 0x28));
    local_1b0[0] = (stringstream)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1b0,1);
    poVar3 = this->out_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    push %",10);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,1);
    local_1b0[0] = (stringstream)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1b0,1);
    poVar3 = this->out_;
    pcVar6 = "    add\n";
    lVar5 = 8;
  }
  else {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(name->_M_dataplus)._M_p,name->_M_string_length);
    pcVar6 = (char *)local_1b0;
    local_1b0[0] = (stringstream)0xa;
    lVar5 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
  this->cur_stack_pos_ = this->cur_stack_pos_ + 1;
  return;
}

Assistant:

void LoadVariableAddr(const std::string& name) {
        LOG
        for (auto iter = scopes_.rbegin(); iter != scopes_.rend(); ++iter) {
            if (iter->Contains(name)) {
                if (!iter->IsGlobal()) {
                    out_ << "    push " << iter->GetOffset(name) << '\n';
                    out_ << "    push %" << StackPointerRegister() << '\n';
                    out_ << "    add\n";
                } else {
                    out_ << "    push " << name << '\n';
                }
                ++cur_stack_pos_;
                return;
            }
        }
        std::stringstream ss;
        ss << "Undefined variable `" << name << '`';
        throw std::runtime_error(ss.str());
    }